

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O2

string * __thiscall
hedg::Lay::instruction
          (string *__return_storage_ptr__,Lay *this,string *market_id,
          vector<hedg::Order,_std::allocator<hedg::Order>_> *orders)

{
  int iVar1;
  pointer pOVar2;
  pointer pOVar3;
  ulong uVar4;
  long lVar5;
  int i;
  ulong uVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string instructions;
  pointer local_68;
  size_type sStack_60;
  pointer local_58;
  size_type sStack_50;
  ulong local_48;
  
  instructions._M_dataplus._M_p = (pointer)&instructions.field_2;
  instructions._M_string_length = 0;
  instructions.field_2._M_local_buf[0] = '\0';
  pOVar2 = (orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pOVar3 = (orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar2 != pOVar3) {
    lVar5 = 0;
    for (uVar6 = 0; uVar4 = ((long)pOVar3 - (long)pOVar2 >> 4) - 1, uVar6 < uVar4; uVar6 = uVar6 + 1
        ) {
      iVar1 = *(int *)((long)&pOVar2->order_type + lVar5);
      if (iVar1 == 1) {
        local_58 = (pointer)(ulong)*(uint *)((long)&(pOVar2->bid).size + lVar5);
        local_68 = (pointer)(ulong)*(uint *)((long)&pOVar2->selection_id + lVar5);
        fmt_00.size_ = 0x81;
        fmt_00.data_ = 
        "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}},"
        ;
        args_00.field_1.values_ =
             (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_68;
        args_00.desc_ = 0x91;
        ::fmt::v8::
        vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                  (&instructions,fmt_00,args_00);
      }
      else if (iVar1 == 0) {
        local_48 = (ulong)*(uint *)((long)&(pOVar2->bid).price + lVar5);
        local_58 = (pointer)(ulong)*(uint *)((long)&(pOVar2->bid).size + lVar5);
        local_68 = (pointer)(ulong)*(uint *)((long)&pOVar2->selection_id + lVar5);
        fmt.size_ = 0x93;
        fmt.data_ = 
        "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}},"
        ;
        args.field_1.values_ =
             (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_68;
        args.desc_ = 0x991;
        ::fmt::v8::
        vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                  (&instructions,fmt,args);
      }
      pOVar2 = (orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pOVar3 = (orders->super__Vector_base<hedg::Order,_std::allocator<hedg::Order>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 0x10;
    }
    pOVar3 = pOVar2 + uVar4;
    if (pOVar2[uVar4].order_type == LIMIT) {
      local_48 = (ulong)(uint)(pOVar3->bid).price;
      local_58 = (pointer)(ulong)(uint)(pOVar3->bid).size;
      local_68 = (pointer)(ulong)(uint)pOVar3->selection_id;
      fmt_02.size_ = 0x92;
      fmt_02.data_ = 
      "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"LIMIT\",\"limitOrder\": {{\"size\": \"{}\",\"price\": \"{}\",\"persistenceType\": \"LAPSE\"}}}}"
      ;
      args_02.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_68;
      args_02.desc_ = 0x991;
      ::fmt::v8::
      vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                (&instructions,fmt_02,args_02);
    }
    else if (pOVar2[uVar4].order_type == SP) {
      local_58 = (pointer)(ulong)(uint)(pOVar3->bid).size;
      local_68 = (pointer)(ulong)(uint)pOVar3->selection_id;
      fmt_01.size_ = 0x80;
      fmt_01.data_ = 
      "{{\"selectionId\": \"{}\",\"handicap\": \"0\",\"side\": \"LAY\",\"orderType\": \"MARKET_ON_CLOSE\",\"marketOnCloseOrder\": {{\"liability\": \"{}\"}}}}"
      ;
      args_01.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_68;
      args_01.desc_ = 0x91;
      ::fmt::v8::
      vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                (&instructions,fmt_01,args_01);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_68 = (market_id->_M_dataplus)._M_p;
  sStack_60 = market_id->_M_string_length;
  local_58 = instructions._M_dataplus._M_p;
  sStack_50 = instructions._M_string_length;
  fmt_03.size_ = 0x7b;
  fmt_03.data_ = 
  "[{{\"jsonrpc\": \"2.0\",\"method\": \"SportsAPING/v1.0/placeOrders\",\"params\": {{\"marketId\": \"{}\",\"instructions\": [{}]}},\"id\": 1}}]"
  ;
  args_03.field_1.values_ =
       (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_68;
  args_03.desc_ = 0xdd;
  ::fmt::v8::
  vformat_to<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,fmt_03,args_03);
  std::__cxx11::string::~string((string *)&instructions);
  return __return_storage_ptr__;
}

Assistant:

std::string Lay::instruction(std::string market_id, std::vector<Order>& orders) {

	std::string instructions;

	if (!orders.empty()) {
		for (int i = 0; i < orders.size() - 1; ++i) {

			if (orders[i].order_type == LIMIT) {
				fmt::format_to(std::back_inserter(instructions),
					"{{"
					"\"selectionId\": \"{}\","
					"\"handicap\": \"0\","
					"\"side\": \"LAY\","
					"\"orderType\": \"LIMIT\","
					"\"limitOrder\": {{"
					"\"size\": \"{}\","
					"\"price\": \"{}\","
					"\"persistenceType\": \"LAPSE\""
					"}}"
					"}},", orders[i].selection_id, orders[i].bid.get_size(), orders[i].bid.get_price());
			}
			else if (orders[i].order_type == SP) {
				fmt::format_to(std::back_inserter(instructions),
					"{{"
					"\"selectionId\": \"{}\","
					"\"handicap\": \"0\","
					"\"side\": \"LAY\","
					"\"orderType\": \"MARKET_ON_CLOSE\","
					"\"marketOnCloseOrder\": {{"
					"\"liability\": \"{}\""
					"}}"
					"}},", orders[i].selection_id, orders[i].bid.get_size());
			}
		}
		if (orders[orders.size() - 1].order_type == LIMIT) {
			fmt::format_to(std::back_inserter(instructions),
				"{{"
				"\"selectionId\": \"{}\","
				"\"handicap\": \"0\","
				"\"side\": \"LAY\","
				"\"orderType\": \"LIMIT\","
				"\"limitOrder\": {{"
				"\"size\": \"{}\","
				"\"price\": \"{}\","
				"\"persistenceType\": \"LAPSE\""
				"}}"
				"}}", orders[orders.size() - 1].selection_id, orders[orders.size() - 1].bid.get_size(), orders[orders.size() - 1].bid.get_price());
		}
		else if (orders[orders.size() - 1].order_type == SP) {
			fmt::format_to(std::back_inserter(instructions),
				"{{"
				"\"selectionId\": \"{}\","
				"\"handicap\": \"0\","
				"\"side\": \"LAY\","
				"\"orderType\": \"MARKET_ON_CLOSE\","
				"\"marketOnCloseOrder\": {{"
				"\"liability\": \"{}\""
				"}}"
				"}}", orders[orders.size() - 1].selection_id, orders[orders.size() - 1].bid.get_size());
		}

	}
	std::string body;

	fmt::format_to(std::back_inserter(body),"["
		"{{"
		"\"jsonrpc\": \"2.0\","
		"\"method\": \"SportsAPING/v1.0/placeOrders\","
		"\"params\": {{"
		"\"marketId\": \"{}\","
		"\"instructions\": ["
		"{}"
		"]"
		"}},"
		"\"id\": 1"
		"}}"
		"]", market_id, instructions);
	
	return body;
}